

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::SocketSet::update(SocketSet *this)

{
  TcpSocket *this_00;
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  _Self __position;
  byte local_51;
  SocketSetData *sdata;
  TcpSocket *sock;
  _Self local_20;
  iterator it;
  bool interesting;
  SocketSet *this_local;
  
  it._M_node._7_1_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<minihttp::TcpSocket_*,_minihttp::SocketSet::SocketSetData,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
       ::begin(&this->_store);
  while( true ) {
    sock = (TcpSocket *)
           std::
           map<minihttp::TcpSocket_*,_minihttp::SocketSet::SocketSetData,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
           ::end(&this->_store);
    bVar1 = std::operator!=(&local_20,(_Self *)&sock);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>
             ::operator->(&local_20);
    this_00 = ppVar3->first;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>
             ::operator->(&local_20);
    bVar1 = TcpSocket::update(this_00);
    local_51 = 1;
    if (!bVar1) {
      local_51 = it._M_node._7_1_;
    }
    it._M_node._7_1_ = local_51 & 1;
    if (((((ppVar3->second).deleteWhenDone & 1U) == 0) ||
        (bVar1 = TcpSocket::isOpen(this_00), bVar1)) ||
       (uVar2 = (*this_00->_vptr_TcpSocket[2])(), (uVar2 & 1) != 0)) {
      std::
      _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>
      ::operator++(&local_20);
    }
    else {
      if (this_00 != (TcpSocket *)0x0) {
        (*this_00->_vptr_TcpSocket[1])();
      }
      __position = std::
                   _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>
                   ::operator++(&local_20,0);
      std::
      map<minihttp::TcpSocket*,minihttp::SocketSet::SocketSetData,std::less<minihttp::TcpSocket*>,std::allocator<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>>
      ::erase_abi_cxx11_((map<minihttp::TcpSocket*,minihttp::SocketSet::SocketSetData,std::less<minihttp::TcpSocket*>,std::allocator<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>>
                          *)&this->_store,(iterator)__position._M_node);
    }
  }
  return (bool)(it._M_node._7_1_ & 1);
}

Assistant:

bool SocketSet::update(void)
{
    bool interesting = false;
    Store::iterator it = _store.begin();
    for( ; it != _store.end(); )
    {
        TcpSocket *sock =  it->first;
        SocketSetData& sdata = it->second;
        interesting = sock->update() || interesting;
        if(sdata.deleteWhenDone && !sock->isOpen() && !sock->HasPendingTask())
        {
            traceprint("Delete socket\n");
            delete sock;
            _store.erase(it++);
        }
        else
           ++it;
    }
    return interesting;
}